

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

unique_lock<std::mutex> __thiscall pbrt::ThreadPool::AddToJobList(ThreadPool *this,ParallelJob *job)

{
  long in_RDX;
  undefined8 extraout_RDX;
  long *in_RSI;
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> uVar1;
  unique_lock<std::mutex> *lock;
  
  std::unique_lock<std::mutex>::unique_lock(in_RDI,(mutex_type *)in_RDI);
  if (*in_RSI != 0) {
    *(long *)(*in_RSI + 8) = in_RDX;
  }
  *(long *)(in_RDX + 0x10) = *in_RSI;
  *in_RSI = in_RDX;
  std::condition_variable::notify_all();
  uVar1._8_8_ = extraout_RDX;
  uVar1._M_device = (mutex_type *)in_RDI;
  return uVar1;
}

Assistant:

std::unique_lock<std::mutex> ThreadPool::AddToJobList(ParallelJob *job) {
    std::unique_lock<std::mutex> lock(jobListMutex);
    if (jobList != nullptr)
        jobList->prev = job;
    job->next = jobList;
    jobList = job;
    jobListCondition.notify_all();
    return lock;
}